

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O3

SinkFinalizeType __thiscall
duckdb::PhysicalUngroupedAggregate::Finalize
          (PhysicalUngroupedAggregate *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  if ((this->distinct_data).
      super_unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DistinctAggregateData_*,_std::default_delete<duckdb::DistinctAggregateData>_>
      .super__Head_base<0UL,_duckdb::DistinctAggregateData_*,_false>._M_head_impl ==
      (DistinctAggregateData *)0x0) {
    *(undefined1 *)
     &input->global_state[3].super_StateWithBlockableTasks.blocked_tasks.
      super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
      super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
      super__Vector_impl_data._M_start = 1;
  }
  else {
    FinalizeDistinct(this,pipeline,event,context,input->global_state);
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalUngroupedAggregate::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                      OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<UngroupedAggregateGlobalSinkState>();

	if (distinct_data) {
		return FinalizeDistinct(pipeline, event, context, input.global_state);
	}

	D_ASSERT(!gstate.finished);
	gstate.finished = true;
	return SinkFinalizeType::READY;
}